

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

void __thiscall zmq::detail::socket_base::disconnect(socket_base *this,char *addr_)

{
  int iVar1;
  error_t *this_00;
  
  iVar1 = zmq_disconnect(this->_handle);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (error_t *)__cxa_allocate_exception(0x10);
  error_t::error_t(this_00);
  __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
}

Assistant:

void disconnect(const char *addr_)
    {
        int rc = zmq_disconnect(_handle, addr_);
        if (rc != 0)
            throw error_t();
    }